

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_table_filter.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::StructFilter::Deserialize(StructFilter *this,Deserializer *deserializer)

{
  unsigned_long child_idx_p;
  StructFilter *this_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_68;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> child_name;
  undefined1 local_38 [32];
  
  child_idx_p = Deserializer::ReadPropertyWithDefault<unsigned_long>(deserializer,200,"child_idx");
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (&child_name,deserializer,0xc9,"child_name");
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
            ((Deserializer *)local_60,(field_id_t)deserializer,(char *)0xca);
  this_00 = (StructFilter *)operator_new(0x40);
  local_38._8_8_ = child_name._M_string_length;
  local_38._0_8_ = local_38 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)child_name._M_dataplus._M_p == &child_name.field_2) {
    local_38._24_8_ = child_name.field_2._8_8_;
  }
  else {
    local_38._0_8_ = child_name._M_dataplus._M_p;
  }
  child_name._M_string_length = 0;
  child_name.field_2._M_local_buf[0] = '\0';
  local_68._M_head_impl = (TableFilter *)local_60;
  local_60 = (undefined1  [8])0x0;
  child_name._M_dataplus._M_p = (pointer)&child_name.field_2;
  StructFilter(this_00,child_idx_p,(string *)local_38,
               (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
               &local_68);
  if (local_68._M_head_impl != (TableFilter *)0x0) {
    (*(local_68._M_head_impl)->_vptr_TableFilter[1])();
  }
  local_68._M_head_impl = (TableFilter *)0x0;
  ::std::__cxx11::string::~string((string *)local_38);
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)this_00;
  if (local_60 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_60 + 8))();
  }
  ::std::__cxx11::string::~string((string *)&child_name);
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> StructFilter::Deserialize(Deserializer &deserializer) {
	auto child_idx = deserializer.ReadPropertyWithDefault<idx_t>(200, "child_idx");
	auto child_name = deserializer.ReadPropertyWithDefault<string>(201, "child_name");
	auto child_filter = deserializer.ReadPropertyWithDefault<unique_ptr<TableFilter>>(202, "child_filter");
	auto result = duckdb::unique_ptr<StructFilter>(new StructFilter(child_idx, std::move(child_name), std::move(child_filter)));
	return std::move(result);
}